

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::NegativeGLSLLinkTimeErrors::Link
          (NegativeGLSLLinkTimeErrors *this,string *cs0,string *cs1)

{
  int local_45c;
  GLchar local_458 [4];
  GLint status;
  GLchar log [1024];
  int local_4c;
  GLchar *pGStack_48;
  GLint status_2;
  char *src_1;
  GLuint sh_1;
  GLint status_1;
  char *src;
  GLuint sh;
  GLuint p;
  string *cs1_local;
  string *cs0_local;
  NegativeGLSLLinkTimeErrors *this_local;
  
  _sh = cs1;
  cs1_local = cs0;
  cs0_local = (string *)this;
  src._4_4_ = glu::CallLogWrapper::glCreateProgram
                        (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper);
  src._0_4_ = glu::CallLogWrapper::glCreateShader
                        (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,0x91b9);
  glu::CallLogWrapper::glAttachShader
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,src._4_4_,(GLuint)src);
  glu::CallLogWrapper::glDeleteShader
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,(GLuint)src);
  _sh_1 = (GLchar *)std::__cxx11::string::c_str();
  glu::CallLogWrapper::glShaderSource
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,(GLuint)src,1,(GLchar **)&sh_1,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,(GLuint)src);
  glu::CallLogWrapper::glGetShaderiv
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,(GLuint)src,0x8b81,(GLint *)((long)&src_1 + 4));
  if (src_1._4_4_ == 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,src._4_4_);
    anon_unknown_0::Output("CS0 compilation should be ok.\n");
    this_local._7_1_ = false;
  }
  else {
    src_1._0_4_ = glu::CallLogWrapper::glCreateShader
                            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                              super_CallLogWrapper,0x91b9);
    glu::CallLogWrapper::glAttachShader
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,src._4_4_,(GLuint)src_1);
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,(GLuint)src_1);
    pGStack_48 = (GLchar *)std::__cxx11::string::c_str();
    glu::CallLogWrapper::glShaderSource
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,(GLuint)src_1,1,&stack0xffffffffffffffb8,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,(GLuint)src_1);
    glu::CallLogWrapper::glGetShaderiv
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,(GLuint)src_1,0x8b81,&local_4c);
    if (local_4c == 0) {
      glu::CallLogWrapper::glDeleteProgram
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,src._4_4_);
      anon_unknown_0::Output("CS1 compilation should be ok.\n");
      this_local._7_1_ = false;
    }
    else {
      glu::CallLogWrapper::glLinkProgram
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,src._4_4_);
      glu::CallLogWrapper::glGetProgramInfoLog
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,src._4_4_,0x400,(GLsizei *)0x0,local_458);
      anon_unknown_0::Output("Program Info Log:\n%s\n",local_458);
      glu::CallLogWrapper::glGetProgramiv
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,src._4_4_,0x8b82,&local_45c);
      glu::CallLogWrapper::glDeleteProgram
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,src._4_4_);
      if (local_45c == 1) {
        anon_unknown_0::Output("Link operation should fail.\n");
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Link(const std::string& cs0, const std::string& cs1)
	{
		const GLuint p = glCreateProgram();

		/* shader 0 */
		{
			GLuint sh = glCreateShader(GL_COMPUTE_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			const char* const src = cs0.c_str();
			glShaderSource(sh, 1, &src, NULL);
			glCompileShader(sh);

			GLint status;
			glGetShaderiv(sh, GL_COMPILE_STATUS, &status);
			if (status == GL_FALSE)
			{
				glDeleteProgram(p);
				Output("CS0 compilation should be ok.\n");
				return false;
			}
		}
		/* shader 1 */
		{
			GLuint sh = glCreateShader(GL_COMPUTE_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			const char* const src = cs1.c_str();
			glShaderSource(sh, 1, &src, NULL);
			glCompileShader(sh);

			GLint status;
			glGetShaderiv(sh, GL_COMPILE_STATUS, &status);
			if (status == GL_FALSE)
			{
				glDeleteProgram(p);
				Output("CS1 compilation should be ok.\n");
				return false;
			}
		}

		glLinkProgram(p);

		GLchar log[1024];
		glGetProgramInfoLog(p, sizeof(log), NULL, log);
		Output("Program Info Log:\n%s\n", log);

		GLint status;
		glGetProgramiv(p, GL_LINK_STATUS, &status);
		glDeleteProgram(p);

		if (status == GL_TRUE)
		{
			Output("Link operation should fail.\n");
			return false;
		}

		return true;
	}